

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::construct_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pvVar4;
  uint *puVar5;
  const_iterator cVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *nxt;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint local_3c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_38;
  
  uVar11 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = graph;
  if (uVar11 < (ulong)((long)(dist->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    puVar2[uVar11] = '\0';
    uVar11 = this->back_;
    uVar9 = uVar11 + 1;
    this->back_ = uVar9;
    puVar3 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if (uVar11 < (ulong)((long)(this->queue_->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2)) {
      puVar3[uVar11] = s;
      if (uVar9 != this->front_) {
        uVar11 = this->front_;
        do {
          uVar7 = uVar11 + 1;
          this->front_ = uVar7;
          puVar3 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->queue_->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar11)
          goto LAB_0010a202;
          uVar12 = (ulong)puVar3[uVar11];
          puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar11 = uVar12;
          if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= uVar12)
          goto LAB_0010a202;
          if (puVar2[uVar12] < this->k_) {
            pvVar4 = (local_38->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(local_38->
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                    -0x5555555555555555;
            if (uVar8 < uVar12 || uVar8 - uVar12 == 0) goto LAB_0010a202;
            puVar10 = pvVar4[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar5 = *(pointer *)
                      ((long)&pvVar4[uVar12].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8);
            if (puVar10 != puVar5) {
              do {
                uVar7 = (ulong)*puVar10;
                puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                uVar9 = (long)(dist->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
                uVar11 = uVar7;
                if (uVar9 <= uVar7) goto LAB_0010a202;
                if (puVar2[uVar7] == '?') {
                  uVar11 = uVar12;
                  if (uVar9 <= uVar12) goto LAB_0010a202;
                  puVar2[uVar7] = puVar2[uVar12] + '\x01';
                  if (this->isD2_ == true) {
                    local_3c = *puVar10;
                    cVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(&(this->parent_->D1_).succ_._M_h,&local_3c);
                    if (cVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) goto LAB_0010a1b9;
                  }
                  uVar1 = *puVar10;
                  uVar11 = this->back_;
                  this->back_ = uVar11 + 1;
                  puVar3 = (this->queue_->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->queue_->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2)
                      <= uVar11) goto LAB_0010a202;
                  puVar3[uVar11] = uVar1;
                }
LAB_0010a1b9:
                puVar10 = puVar10 + 1;
              } while (puVar10 != puVar5);
              uVar9 = this->back_;
              uVar7 = this->front_;
            }
          }
          uVar11 = uVar7;
        } while (uVar9 != uVar7);
      }
      return;
    }
  }
LAB_0010a202:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::construct_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                          std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    dist.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}